

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

ssize_t __thiscall jessilib::config::write(config *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  logic_error *this_00;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  if ((this->m_filename)._M_pathname._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Failed assertion: \'!m_filename.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:94"
               ,0xab);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Failed assertion: \'!m_filename.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:94"
              );
  }
  else {
    if ((this->m_format)._M_string_length != 0) {
      write_object(&this->m_data,&this->m_filename,&this->m_format,utf_8);
      iVar1 = pthread_rwlock_unlock((pthread_rwlock_t *)this);
      return CONCAT44(extraout_var,iVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Failed assertion: \'!m_format.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:95"
               ,0xa9);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Failed assertion: \'!m_format.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:95"
              );
  }
  *(undefined ***)this_00 = &PTR__logic_error_001b1d98;
  __cxa_throw(this_00,&assertion_failed::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void config::write() const {
	std::shared_lock<std::shared_mutex> guard{ m_mutex };

	if (jessilib_debug_assert(!m_filename.empty())
		&& jessilib_debug_assert(!m_format.empty())) {
		// Write data to disk
		write_object(m_data, m_filename, m_format);
	}
}